

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::IsSealed
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  int iVar1;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar2;
  ArrayObject *pAVar3;
  uint uVar4;
  
  if (((this->super_DynamicTypeHandler).flags & 1) != 0) {
    return 0;
  }
  uVar4 = 0;
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    this_00 = (this->propertyMap).ptr;
    if (this_00->count - this_00->freeCount <= (int)uVar4) break;
    pDVar2 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetReferenceAt(this_00,uVar4);
    uVar4 = uVar4 + 1;
    if ((pDVar2->Attributes & 0x1a) == 2) {
      return 0;
    }
  }
  pAVar3 = DynamicObject::GetObjectArray(instance);
  if ((pAVar3 != (ArrayObject *)0x0) &&
     (iVar1 = (*(pAVar3->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x39])(pAVar3), iVar1 == 0
     )) {
    return 0;
  }
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::IsSealed(DynamicObject* instance)
    {
        if (this->GetFlags() & IsExtensibleFlag)
        {
            return false;
        }

        DictionaryPropertyDescriptor<T> *descriptor = nullptr;
        for (T index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if ((!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal)))
            {
                if (descriptor->Attributes & PropertyConfigurable)
                {
                    // [[Configurable]] must be false for all (existing) properties.
                    // IE9 compatibility: keep IE9 behavior (also check deleted properties)
                    return false;
                }
            }
        }

        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray && !objectArray->IsSealed())
        {
            return false;
        }

        return true;
    }